

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::BatchedMatMulLayerParams::ByteSizeLong(BatchedMatMulLayerParams *this)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  
  if (this->weights_ == (WeightParams *)0x0 ||
      this == (BatchedMatMulLayerParams *)&_BatchedMatMulLayerParams_default_instance_) {
    sVar3 = 0;
  }
  else {
    sVar3 = WeightParams::ByteSizeLong(this->weights_);
    uVar6 = (uint)sVar3 | 1;
    iVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->bias_ != (WeightParams *)0x0 &&
      this != (BatchedMatMulLayerParams *)&_BatchedMatMulLayerParams_default_instance_) {
    sVar4 = WeightParams::ByteSizeLong(this->bias_);
    uVar6 = (uint)sVar4 | 1;
    iVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->weightmatrixfirstdimension_ != 0) {
    uVar5 = this->weightmatrixfirstdimension_ | 1;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->weightmatrixseconddimension_ != 0) {
    uVar5 = this->weightmatrixseconddimension_ | 1;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar4 = sVar3 + 2;
  if (this->transposea_ == false) {
    sVar4 = sVar3;
  }
  sVar3 = sVar4 + 2;
  if (this->transposeb_ == false) {
    sVar3 = sVar4;
  }
  sVar4 = sVar3 + 2;
  if (this->hasbias_ == false) {
    sVar4 = sVar3;
  }
  sVar3 = sVar4 + 2;
  if (this->int8dynamicquantize_ == false) {
    sVar3 = sVar4;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t BatchedMatMulLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BatchedMatMulLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.WeightParams weights = 8;
  if (this->has_weights()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->weights_);
  }

  // .CoreML.Specification.WeightParams bias = 9;
  if (this->has_bias()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->bias_);
  }

  // uint64 weightMatrixFirstDimension = 5;
  if (this->weightmatrixfirstdimension() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->weightmatrixfirstdimension());
  }

  // uint64 weightMatrixSecondDimension = 6;
  if (this->weightmatrixseconddimension() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->weightmatrixseconddimension());
  }

  // bool transposeA = 1;
  if (this->transposea() != 0) {
    total_size += 1 + 1;
  }

  // bool transposeB = 2;
  if (this->transposeb() != 0) {
    total_size += 1 + 1;
  }

  // bool hasBias = 7;
  if (this->hasbias() != 0) {
    total_size += 1 + 1;
  }

  // bool int8DynamicQuantize = 10;
  if (this->int8dynamicquantize() != 0) {
    total_size += 1 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}